

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void SSTable::readDic(string *fileName,SSTableDic *dic)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  runtime_error *this;
  reference pvVar5;
  char *pcVar6;
  reference __args;
  allocator local_301;
  string local_300 [8];
  string value;
  char *buf;
  pointer puStack_2d0;
  value_type valueSize;
  uint64_t i_1;
  uint64_t i;
  int offset;
  uint64_t key;
  vector<int,_std::allocator<int>_> offsets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> keys;
  uint64_t length;
  char local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [48];
  ifstream local_220 [8];
  ifstream in;
  SSTableDic *dic_local;
  string *fileName_local;
  
  _Var4 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_220,(string *)fileName,_Var4);
  bVar3 = std::ios::fail();
  if ((bVar3 & 1) == 0) {
    std::istream::seekg((long)local_220,8);
    read64(local_220,
           (uint64_t *)
           &keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
    std::istream::seekg((long)local_220,0x2820);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&key);
    for (i_1 = 0; i_1 < keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage; i_1 = i_1 + 1) {
      read64(local_220,(uint64_t *)&stack0xfffffffffffffd48);
      read32(local_220,(int *)((long)&i + 4));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict *)&stack0xfffffffffffffd48);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&key,(value_type_conflict1 *)((long)&i + 4));
    }
    read64(local_220,(uint64_t *)&stack0xfffffffffffffd48);
    read32(local_220,(int *)((long)&i + 4));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&key,(value_type_conflict1 *)((long)&i + 4));
    for (puStack_2d0 = (pointer)0x0;
        puStack_2d0 <
        keys.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage; puStack_2d0 = (pointer)((long)puStack_2d0 + 1)) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&key,(long)puStack_2d0 + 1);
      iVar1 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&key,(size_type)puStack_2d0);
      iVar2 = *pvVar5;
      pcVar6 = (char *)operator_new__((long)((iVar1 - iVar2) + 1));
      std::istream::read((char *)local_220,(long)pcVar6);
      pcVar6[iVar1 - iVar2] = '\0';
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,pcVar6,&local_301);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      if (pcVar6 != (char *)0x0) {
        operator_delete__(pcVar6);
      }
      __args = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(size_type)puStack_2d0);
      std::
      vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
      ::emplace_back<unsigned_long&,std::__cxx11::string&>
                ((vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
                  *)dic,__args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300);
      std::__cxx11::string::~string(local_300);
    }
    std::ifstream::close();
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&key);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::ifstream::~ifstream(local_220);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "readDic: Open file ");
  std::operator+(local_250,local_270);
  std::runtime_error::runtime_error(this,(string *)local_250);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SSTable::readDic(const string &fileName, SSTableDic &dic) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  uint64_t length;
  in.seekg(8, ifstream::beg);  // skip timeStamp
  read64(in, length);
  in.seekg(10272, ifstream::beg);  // skip header and bloomFilter

  // read keys and offsets
  vector<uint64_t> keys;
  vector<int> offsets;
  uint64_t key;
  int offset;
  for (uint64_t i = 0; i < length; i++) {
    read64(in, key);
    read32(in, offset);
    keys.push_back(key);
    offsets.push_back(offset);
  }
  read64(in, key);
  read32(in, offset);
  offsets.push_back(offset);

  // read values
  for (uint64_t i = 0; i < length; i++) {
    auto valueSize = offsets[i + 1] - offsets[i];
    char *buf = new char[valueSize + 1];
    in.read(buf, valueSize);
    buf[valueSize] = '\0';
    string value(buf);
    delete[] buf;
    dic.emplace_back(keys[i], value);
  }

  in.close();
}